

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void __thiscall ImDrawListSplitter::Merge(ImDrawListSplitter *this,ImDrawList *draw_list)

{
  ImDrawCmdHeader *pIVar1;
  ImDrawChannel *pIVar2;
  ImDrawChannel *pIVar3;
  bool bVar4;
  undefined8 uVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  uint uVar10;
  long lVar11;
  long lVar12;
  ImDrawCmd *pIVar13;
  uint *__dest;
  int iVar14;
  int iVar15;
  long lVar16;
  ImDrawCmd *pIVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  uint *puVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  
  if (1 < this->_Count) {
    SetCurrentChannel(this,draw_list,0);
    uVar10 = (draw_list->CmdBuffer).Size;
    if (0 < (int)uVar10) {
      pIVar17 = (draw_list->CmdBuffer).Data;
      do {
        if ((pIVar17[(ulong)uVar10 - 1].ElemCount != 0) ||
           (pIVar17[(ulong)uVar10 - 1].UserCallback != (ImDrawCallback)0x0)) break;
        (draw_list->CmdBuffer).Size = uVar10 - 1;
        bVar4 = 1 < (int)uVar10;
        uVar10 = uVar10 - 1;
      } while (bVar4);
    }
    iVar20 = 0;
    if ((this->_Count < 1) || (lVar11 = (long)(draw_list->CmdBuffer).Size, lVar11 < 1)) {
      pIVar17 = (ImDrawCmd *)0x0;
    }
    else {
      pIVar17 = (draw_list->CmdBuffer).Data + lVar11 + -1;
    }
    if (pIVar17 != (ImDrawCmd *)0x0) {
      iVar20 = pIVar17->ElemCount + pIVar17->IdxOffset;
    }
    iVar15 = 0;
    iVar18 = 0;
    if (1 < this->_Count) {
      iVar18 = 0;
      lVar11 = 1;
      iVar15 = 0;
      do {
        pIVar2 = (this->_Channels).Data;
        pIVar3 = pIVar2 + lVar11;
        iVar14 = pIVar2[lVar11]._CmdBuffer.Size;
        lVar12 = (long)iVar14;
        if (0 < lVar12) {
          pIVar13 = (pIVar3->_CmdBuffer).Data;
          if ((pIVar13[lVar12 + -1].ElemCount == 0) &&
             (pIVar13[lVar12 + -1].UserCallback == (ImDrawCallback)0x0)) {
            (pIVar3->_CmdBuffer).Size = iVar14 + -1;
          }
        }
        lVar12 = (long)(pIVar3->_CmdBuffer).Size;
        if ((0 < lVar12) && (pIVar17 != (ImDrawCmd *)0x0)) {
          pIVar13 = (pIVar3->_CmdBuffer).Data;
          auVar24[0] = -(*(char *)&(pIVar13->ClipRect).x == *(char *)&(pIVar17->ClipRect).x);
          auVar24[1] = -(*(char *)((long)&(pIVar13->ClipRect).x + 1) ==
                        *(char *)((long)&(pIVar17->ClipRect).x + 1));
          auVar24[2] = -(*(char *)((long)&(pIVar13->ClipRect).x + 2) ==
                        *(char *)((long)&(pIVar17->ClipRect).x + 2));
          auVar24[3] = -(*(char *)((long)&(pIVar13->ClipRect).x + 3) ==
                        *(char *)((long)&(pIVar17->ClipRect).x + 3));
          auVar24[4] = -(*(char *)&(pIVar13->ClipRect).y == *(char *)&(pIVar17->ClipRect).y);
          auVar24[5] = -(*(char *)((long)&(pIVar13->ClipRect).y + 1) ==
                        *(char *)((long)&(pIVar17->ClipRect).y + 1));
          auVar24[6] = -(*(char *)((long)&(pIVar13->ClipRect).y + 2) ==
                        *(char *)((long)&(pIVar17->ClipRect).y + 2));
          auVar24[7] = -(*(char *)((long)&(pIVar13->ClipRect).y + 3) ==
                        *(char *)((long)&(pIVar17->ClipRect).y + 3));
          auVar24[8] = -(*(char *)&(pIVar13->ClipRect).z == *(char *)&(pIVar17->ClipRect).z);
          auVar24[9] = -(*(char *)((long)&(pIVar13->ClipRect).z + 1) ==
                        *(char *)((long)&(pIVar17->ClipRect).z + 1));
          auVar24[10] = -(*(char *)((long)&(pIVar13->ClipRect).z + 2) ==
                         *(char *)((long)&(pIVar17->ClipRect).z + 2));
          auVar24[0xb] = -(*(char *)((long)&(pIVar13->ClipRect).z + 3) ==
                          *(char *)((long)&(pIVar17->ClipRect).z + 3));
          auVar24[0xc] = -(*(char *)&(pIVar13->ClipRect).w == *(char *)&(pIVar17->ClipRect).w);
          auVar24[0xd] = -(*(char *)((long)&(pIVar13->ClipRect).w + 1) ==
                          *(char *)((long)&(pIVar17->ClipRect).w + 1));
          auVar24[0xe] = -(*(char *)((long)&(pIVar13->ClipRect).w + 2) ==
                          *(char *)((long)&(pIVar17->ClipRect).w + 2));
          auVar24[0xf] = -(*(char *)((long)&(pIVar13->ClipRect).w + 3) ==
                          *(char *)((long)&(pIVar17->ClipRect).w + 3));
          auVar22[0] = -(*(char *)&(pIVar13->ClipRect).w == *(char *)&(pIVar17->ClipRect).w);
          auVar22[1] = -(*(char *)((long)&(pIVar13->ClipRect).w + 1) ==
                        *(char *)((long)&(pIVar17->ClipRect).w + 1));
          auVar22[2] = -(*(char *)((long)&(pIVar13->ClipRect).w + 2) ==
                        *(char *)((long)&(pIVar17->ClipRect).w + 2));
          auVar22[3] = -(*(char *)((long)&(pIVar13->ClipRect).w + 3) ==
                        *(char *)((long)&(pIVar17->ClipRect).w + 3));
          auVar22[4] = -(*(char *)&pIVar13->TextureId == *(char *)&pIVar17->TextureId);
          auVar22[5] = -(*(char *)((long)&pIVar13->TextureId + 1) ==
                        *(char *)((long)&pIVar17->TextureId + 1));
          auVar22[6] = -(*(char *)((long)&pIVar13->TextureId + 2) ==
                        *(char *)((long)&pIVar17->TextureId + 2));
          auVar22[7] = -(*(char *)((long)&pIVar13->TextureId + 3) ==
                        *(char *)((long)&pIVar17->TextureId + 3));
          auVar22[8] = -(*(char *)((long)&pIVar13->TextureId + 4) ==
                        *(char *)((long)&pIVar17->TextureId + 4));
          auVar22[9] = -(*(char *)((long)&pIVar13->TextureId + 5) ==
                        *(char *)((long)&pIVar17->TextureId + 5));
          auVar22[10] = -(*(char *)((long)&pIVar13->TextureId + 6) ==
                         *(char *)((long)&pIVar17->TextureId + 6));
          auVar22[0xb] = -(*(char *)((long)&pIVar13->TextureId + 7) ==
                          *(char *)((long)&pIVar17->TextureId + 7));
          auVar22[0xc] = -((char)pIVar13->VtxOffset == (char)pIVar17->VtxOffset);
          auVar22[0xd] = -(*(char *)((long)&pIVar13->VtxOffset + 1) ==
                          *(char *)((long)&pIVar17->VtxOffset + 1));
          auVar22[0xe] = -(*(char *)((long)&pIVar13->VtxOffset + 2) ==
                          *(char *)((long)&pIVar17->VtxOffset + 2));
          auVar22[0xf] = -(*(char *)((long)&pIVar13->VtxOffset + 3) ==
                          *(char *)((long)&pIVar17->VtxOffset + 3));
          auVar22 = auVar22 & auVar24;
          if (((ushort)((ushort)(SUB161(auVar22 >> 7,0) & 1) |
                        (ushort)(SUB161(auVar22 >> 0xf,0) & 1) << 1 |
                        (ushort)(SUB161(auVar22 >> 0x17,0) & 1) << 2 |
                        (ushort)(SUB161(auVar22 >> 0x1f,0) & 1) << 3 |
                        (ushort)(SUB161(auVar22 >> 0x27,0) & 1) << 4 |
                        (ushort)(SUB161(auVar22 >> 0x2f,0) & 1) << 5 |
                        (ushort)(SUB161(auVar22 >> 0x37,0) & 1) << 6 |
                        (ushort)(SUB161(auVar22 >> 0x3f,0) & 1) << 7 |
                        (ushort)(SUB161(auVar22 >> 0x47,0) & 1) << 8 |
                        (ushort)(SUB161(auVar22 >> 0x4f,0) & 1) << 9 |
                        (ushort)(SUB161(auVar22 >> 0x57,0) & 1) << 10 |
                        (ushort)(SUB161(auVar22 >> 0x5f,0) & 1) << 0xb |
                        (ushort)(SUB161(auVar22 >> 0x67,0) & 1) << 0xc |
                        (ushort)(SUB161(auVar22 >> 0x6f,0) & 1) << 0xd |
                        (ushort)(SUB161(auVar22 >> 0x77,0) & 1) << 0xe |
                       (ushort)(byte)(auVar22[0xf] >> 7) << 0xf) == 0xffff) &&
             (pIVar13->UserCallback == (ImDrawCallback)0x0 &&
              pIVar17->UserCallback == (ImDrawCallback)0x0)) {
            pIVar17->ElemCount = pIVar17->ElemCount + pIVar13->ElemCount;
            iVar20 = iVar20 + pIVar13->ElemCount;
            memmove(pIVar13,pIVar13 + 1,lVar12 * 0x38 - 0x38);
            (pIVar3->_CmdBuffer).Size = (pIVar3->_CmdBuffer).Size + -1;
          }
        }
        iVar14 = (pIVar3->_CmdBuffer).Size;
        lVar12 = (long)iVar14;
        if (0 < lVar12) {
          pIVar17 = (pIVar3->_CmdBuffer).Data + lVar12 + -1;
        }
        iVar15 = iVar15 + (pIVar3->_IdxBuffer).Size;
        if (0 < iVar14) {
          pIVar13 = (pIVar3->_CmdBuffer).Data;
          lVar16 = 0;
          do {
            *(int *)((long)&pIVar13->IdxOffset + lVar16) = iVar20;
            iVar20 = iVar20 + *(int *)((long)&pIVar13->ElemCount + lVar16);
            lVar16 = lVar16 + 0x38;
          } while (lVar12 * 0x38 - lVar16 != 0);
        }
        iVar18 = iVar18 + iVar14;
        lVar11 = lVar11 + 1;
      } while (lVar11 < this->_Count);
    }
    iVar14 = (draw_list->CmdBuffer).Size + iVar18;
    iVar20 = (draw_list->CmdBuffer).Capacity;
    if (iVar20 < iVar14) {
      if (iVar20 == 0) {
        iVar19 = 8;
      }
      else {
        iVar19 = iVar20 / 2 + iVar20;
      }
      if (iVar19 <= iVar14) {
        iVar19 = iVar14;
      }
      if (iVar20 < iVar19) {
        pIVar13 = (ImDrawCmd *)ImGui::MemAlloc((long)iVar19 * 0x38);
        pIVar17 = (draw_list->CmdBuffer).Data;
        if (pIVar17 != (ImDrawCmd *)0x0) {
          memcpy(pIVar13,pIVar17,(long)(draw_list->CmdBuffer).Size * 0x38);
          ImGui::MemFree((draw_list->CmdBuffer).Data);
        }
        (draw_list->CmdBuffer).Data = pIVar13;
        (draw_list->CmdBuffer).Capacity = iVar19;
      }
    }
    (draw_list->CmdBuffer).Size = iVar14;
    lVar11 = (long)(draw_list->IdxBuffer).Size + (long)iVar15;
    iVar20 = (draw_list->IdxBuffer).Capacity;
    iVar14 = (int)lVar11;
    if (iVar20 < iVar14) {
      if (iVar20 == 0) {
        iVar19 = 8;
      }
      else {
        iVar19 = iVar20 / 2 + iVar20;
      }
      if (iVar19 <= iVar14) {
        iVar19 = iVar14;
      }
      if (iVar20 < iVar19) {
        __dest = (uint *)ImGui::MemAlloc((long)iVar19 << 2);
        puVar21 = (draw_list->IdxBuffer).Data;
        if (puVar21 != (uint *)0x0) {
          memcpy(__dest,puVar21,(long)(draw_list->IdxBuffer).Size << 2);
          ImGui::MemFree((draw_list->IdxBuffer).Data);
        }
        (draw_list->IdxBuffer).Data = __dest;
        (draw_list->IdxBuffer).Capacity = iVar19;
      }
    }
    (draw_list->IdxBuffer).Size = iVar14;
    puVar21 = (draw_list->IdxBuffer).Data + (lVar11 - iVar15);
    if (1 < this->_Count) {
      pIVar17 = (draw_list->CmdBuffer).Data + ((long)(draw_list->CmdBuffer).Size - (long)iVar18);
      lVar11 = 1;
      lVar12 = 0x38;
      do {
        pIVar3 = (this->_Channels).Data;
        lVar16 = (long)*(int *)((long)pIVar3 + lVar12 + -0x18);
        if (lVar16 != 0) {
          memcpy(pIVar17,*(void **)((long)pIVar3 + lVar12 + -0x10),lVar16 * 0x38);
          pIVar17 = pIVar17 + lVar16;
        }
        lVar16 = (long)*(int *)((long)pIVar3 + lVar12 + -8);
        if (lVar16 != 0) {
          memcpy(puVar21,*(void **)((long)&(pIVar3->_CmdBuffer).Size + lVar12),lVar16 * 4);
          puVar21 = puVar21 + lVar16;
        }
        lVar11 = lVar11 + 1;
        lVar12 = lVar12 + 0x20;
      } while (lVar11 < this->_Count);
    }
    draw_list->_IdxWritePtr = puVar21;
    lVar11 = (long)(draw_list->CmdBuffer).Size;
    if ((lVar11 == 0) ||
       ((draw_list->CmdBuffer).Data[lVar11 + -1].UserCallback != (ImDrawCallback)0x0)) {
      ImDrawList::AddDrawCmd(draw_list);
    }
    pIVar17 = (draw_list->CmdBuffer).Data;
    iVar20 = (draw_list->CmdBuffer).Size;
    pIVar13 = pIVar17 + (long)iVar20 + -1;
    pIVar1 = &draw_list->_CmdHeader;
    if (pIVar17[(long)iVar20 + -1].ElemCount == 0) {
      fVar6 = (pIVar1->ClipRect).x;
      fVar7 = (pIVar1->ClipRect).y;
      fVar8 = (draw_list->_CmdHeader).ClipRect.z;
      fVar9 = (draw_list->_CmdHeader).ClipRect.w;
      uVar5 = *(undefined8 *)((long)&(draw_list->_CmdHeader).TextureId + 4);
      *(undefined8 *)&pIVar17[(long)iVar20 + -1].ClipRect.w =
           *(undefined8 *)&(draw_list->_CmdHeader).ClipRect.w;
      *(undefined8 *)((long)&pIVar17[(long)iVar20 + -1].TextureId + 4) = uVar5;
      (pIVar13->ClipRect).x = fVar6;
      (pIVar13->ClipRect).y = fVar7;
      pIVar17[(long)iVar20 + -1].ClipRect.z = fVar8;
      pIVar17[(long)iVar20 + -1].ClipRect.w = fVar9;
    }
    else {
      auVar25[0] = -(*(char *)&(pIVar1->ClipRect).x == *(char *)&(pIVar13->ClipRect).x);
      auVar25[1] = -(*(char *)((long)&(draw_list->_CmdHeader).ClipRect.x + 1) ==
                    *(char *)((long)&pIVar17[(long)iVar20 + -1].ClipRect.x + 1));
      auVar25[2] = -(*(char *)((long)&(draw_list->_CmdHeader).ClipRect.x + 2) ==
                    *(char *)((long)&pIVar17[(long)iVar20 + -1].ClipRect.x + 2));
      auVar25[3] = -(*(char *)((long)&(draw_list->_CmdHeader).ClipRect.x + 3) ==
                    *(char *)((long)&pIVar17[(long)iVar20 + -1].ClipRect.x + 3));
      auVar25[4] = -(*(char *)&(draw_list->_CmdHeader).ClipRect.y ==
                    *(char *)&pIVar17[(long)iVar20 + -1].ClipRect.y);
      auVar25[5] = -(*(char *)((long)&(draw_list->_CmdHeader).ClipRect.y + 1) ==
                    *(char *)((long)&pIVar17[(long)iVar20 + -1].ClipRect.y + 1));
      auVar25[6] = -(*(char *)((long)&(draw_list->_CmdHeader).ClipRect.y + 2) ==
                    *(char *)((long)&pIVar17[(long)iVar20 + -1].ClipRect.y + 2));
      auVar25[7] = -(*(char *)((long)&(draw_list->_CmdHeader).ClipRect.y + 3) ==
                    *(char *)((long)&pIVar17[(long)iVar20 + -1].ClipRect.y + 3));
      auVar25[8] = -(*(char *)&(draw_list->_CmdHeader).ClipRect.z ==
                    *(char *)&pIVar17[(long)iVar20 + -1].ClipRect.z);
      auVar25[9] = -(*(char *)((long)&(draw_list->_CmdHeader).ClipRect.z + 1) ==
                    *(char *)((long)&pIVar17[(long)iVar20 + -1].ClipRect.z + 1));
      auVar25[10] = -(*(char *)((long)&(draw_list->_CmdHeader).ClipRect.z + 2) ==
                     *(char *)((long)&pIVar17[(long)iVar20 + -1].ClipRect.z + 2));
      auVar25[0xb] = -(*(char *)((long)&(draw_list->_CmdHeader).ClipRect.z + 3) ==
                      *(char *)((long)&pIVar17[(long)iVar20 + -1].ClipRect.z + 3));
      auVar25[0xc] = -(*(char *)&(draw_list->_CmdHeader).ClipRect.w ==
                      *(char *)&pIVar17[(long)iVar20 + -1].ClipRect.w);
      auVar25[0xd] = -(*(char *)((long)&(draw_list->_CmdHeader).ClipRect.w + 1) ==
                      *(char *)((long)&pIVar17[(long)iVar20 + -1].ClipRect.w + 1));
      auVar25[0xe] = -(*(char *)((long)&(draw_list->_CmdHeader).ClipRect.w + 2) ==
                      *(char *)((long)&pIVar17[(long)iVar20 + -1].ClipRect.w + 2));
      auVar25[0xf] = -(*(char *)((long)&(draw_list->_CmdHeader).ClipRect.w + 3) ==
                      *(char *)((long)&pIVar17[(long)iVar20 + -1].ClipRect.w + 3));
      auVar23[0] = -(*(char *)&(draw_list->_CmdHeader).ClipRect.w ==
                    *(char *)&pIVar17[(long)iVar20 + -1].ClipRect.w);
      auVar23[1] = -(*(char *)((long)&(draw_list->_CmdHeader).ClipRect.w + 1) ==
                    *(char *)((long)&pIVar17[(long)iVar20 + -1].ClipRect.w + 1));
      auVar23[2] = -(*(char *)((long)&(draw_list->_CmdHeader).ClipRect.w + 2) ==
                    *(char *)((long)&pIVar17[(long)iVar20 + -1].ClipRect.w + 2));
      auVar23[3] = -(*(char *)((long)&(draw_list->_CmdHeader).ClipRect.w + 3) ==
                    *(char *)((long)&pIVar17[(long)iVar20 + -1].ClipRect.w + 3));
      auVar23[4] = -(*(char *)&(draw_list->_CmdHeader).TextureId ==
                    *(char *)&pIVar17[(long)iVar20 + -1].TextureId);
      auVar23[5] = -(*(char *)((long)&(draw_list->_CmdHeader).TextureId + 1) ==
                    *(char *)((long)&pIVar17[(long)iVar20 + -1].TextureId + 1));
      auVar23[6] = -(*(char *)((long)&(draw_list->_CmdHeader).TextureId + 2) ==
                    *(char *)((long)&pIVar17[(long)iVar20 + -1].TextureId + 2));
      auVar23[7] = -(*(char *)((long)&(draw_list->_CmdHeader).TextureId + 3) ==
                    *(char *)((long)&pIVar17[(long)iVar20 + -1].TextureId + 3));
      auVar23[8] = -(*(char *)((long)&(draw_list->_CmdHeader).TextureId + 4) ==
                    *(char *)((long)&pIVar17[(long)iVar20 + -1].TextureId + 4));
      auVar23[9] = -(*(char *)((long)&(draw_list->_CmdHeader).TextureId + 5) ==
                    *(char *)((long)&pIVar17[(long)iVar20 + -1].TextureId + 5));
      auVar23[10] = -(*(char *)((long)&(draw_list->_CmdHeader).TextureId + 6) ==
                     *(char *)((long)&pIVar17[(long)iVar20 + -1].TextureId + 6));
      auVar23[0xb] = -(*(char *)((long)&(draw_list->_CmdHeader).TextureId + 7) ==
                      *(char *)((long)&pIVar17[(long)iVar20 + -1].TextureId + 7));
      auVar23[0xc] = -((char)(draw_list->_CmdHeader).VtxOffset ==
                      (char)pIVar17[(long)iVar20 + -1].VtxOffset);
      auVar23[0xd] = -(*(char *)((long)&(draw_list->_CmdHeader).VtxOffset + 1) ==
                      *(char *)((long)&pIVar17[(long)iVar20 + -1].VtxOffset + 1));
      auVar23[0xe] = -(*(char *)((long)&(draw_list->_CmdHeader).VtxOffset + 2) ==
                      *(char *)((long)&pIVar17[(long)iVar20 + -1].VtxOffset + 2));
      auVar23[0xf] = -(*(char *)((long)&(draw_list->_CmdHeader).VtxOffset + 3) ==
                      *(char *)((long)&pIVar17[(long)iVar20 + -1].VtxOffset + 3));
      auVar23 = auVar23 & auVar25;
      if ((ushort)((ushort)(SUB161(auVar23 >> 7,0) & 1) |
                   (ushort)(SUB161(auVar23 >> 0xf,0) & 1) << 1 |
                   (ushort)(SUB161(auVar23 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar23 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar23 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar23 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar23 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar23 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar23 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar23 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar23 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar23 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar23 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar23 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar23 >> 0x77,0) & 1) << 0xe |
                  (ushort)(byte)(auVar23[0xf] >> 7) << 0xf) != 0xffff) {
        ImDrawList::AddDrawCmd(draw_list);
      }
    }
    this->_Count = 1;
  }
  return;
}

Assistant:

void ImDrawListSplitter::Merge(ImDrawList* draw_list)
{
    // Note that we never use or rely on _Channels.Size because it is merely a buffer that we never shrink back to 0 to keep all sub-buffers ready for use.
    if (_Count <= 1)
        return;

    SetCurrentChannel(draw_list, 0);
    draw_list->_PopUnusedDrawCmd();

    // Calculate our final buffer sizes. Also fix the incorrect IdxOffset values in each command.
    int new_cmd_buffer_count = 0;
    int new_idx_buffer_count = 0;
    ImDrawCmd* last_cmd = (_Count > 0 && draw_list->CmdBuffer.Size > 0) ? &draw_list->CmdBuffer.back() : NULL;
    int idx_offset = last_cmd ? last_cmd->IdxOffset + last_cmd->ElemCount : 0;
    for (int i = 1; i < _Count; i++)
    {
        ImDrawChannel& ch = _Channels[i];
        if (ch._CmdBuffer.Size > 0 && ch._CmdBuffer.back().ElemCount == 0 && ch._CmdBuffer.back().UserCallback == NULL) // Equivalent of PopUnusedDrawCmd()
            ch._CmdBuffer.pop_back();

        if (ch._CmdBuffer.Size > 0 && last_cmd != NULL)
        {
            // Do not include ImDrawCmd_AreSequentialIdxOffset() in the compare as we rebuild IdxOffset values ourselves.
            // Manipulating IdxOffset (e.g. by reordering draw commands like done by RenderDimmedBackgroundBehindWindow()) is not supported within a splitter.
            ImDrawCmd* next_cmd = &ch._CmdBuffer[0];
            if (ImDrawCmd_HeaderCompare(last_cmd, next_cmd) == 0 && last_cmd->UserCallback == NULL && next_cmd->UserCallback == NULL)
            {
                // Merge previous channel last draw command with current channel first draw command if matching.
                last_cmd->ElemCount += next_cmd->ElemCount;
                idx_offset += next_cmd->ElemCount;
                ch._CmdBuffer.erase(ch._CmdBuffer.Data); // FIXME-OPT: Improve for multiple merges.
            }
        }
        if (ch._CmdBuffer.Size > 0)
            last_cmd = &ch._CmdBuffer.back();
        new_cmd_buffer_count += ch._CmdBuffer.Size;
        new_idx_buffer_count += ch._IdxBuffer.Size;
        for (int cmd_n = 0; cmd_n < ch._CmdBuffer.Size; cmd_n++)
        {
            ch._CmdBuffer.Data[cmd_n].IdxOffset = idx_offset;
            idx_offset += ch._CmdBuffer.Data[cmd_n].ElemCount;
        }
    }
    draw_list->CmdBuffer.resize(draw_list->CmdBuffer.Size + new_cmd_buffer_count);
    draw_list->IdxBuffer.resize(draw_list->IdxBuffer.Size + new_idx_buffer_count);

    // Write commands and indices in order (they are fairly small structures, we don't copy vertices only indices)
    ImDrawCmd* cmd_write = draw_list->CmdBuffer.Data + draw_list->CmdBuffer.Size - new_cmd_buffer_count;
    ImDrawIdx* idx_write = draw_list->IdxBuffer.Data + draw_list->IdxBuffer.Size - new_idx_buffer_count;
    for (int i = 1; i < _Count; i++)
    {
        ImDrawChannel& ch = _Channels[i];
        if (int sz = ch._CmdBuffer.Size) { memcpy(cmd_write, ch._CmdBuffer.Data, sz * sizeof(ImDrawCmd)); cmd_write += sz; }
        if (int sz = ch._IdxBuffer.Size) { memcpy(idx_write, ch._IdxBuffer.Data, sz * sizeof(ImDrawIdx)); idx_write += sz; }
    }
    draw_list->_IdxWritePtr = idx_write;

    // Ensure there's always a non-callback draw command trailing the command-buffer
    if (draw_list->CmdBuffer.Size == 0 || draw_list->CmdBuffer.back().UserCallback != NULL)
        draw_list->AddDrawCmd();

    // If current command is used with different settings we need to add a new command
    ImDrawCmd* curr_cmd = &draw_list->CmdBuffer.Data[draw_list->CmdBuffer.Size - 1];
    if (curr_cmd->ElemCount == 0)
        ImDrawCmd_HeaderCopy(curr_cmd, &draw_list->_CmdHeader); // Copy ClipRect, TextureId, VtxOffset
    else if (ImDrawCmd_HeaderCompare(curr_cmd, &draw_list->_CmdHeader) != 0)
        draw_list->AddDrawCmd();

    _Count = 1;
}